

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_fail_conn(nn_sws *self,int code,char *reason)

{
  ulong uVar1;
  char *pcVar2;
  char *buf;
  size_t sVar3;
  size_t __n;
  ulong uVar4;
  uint8_t rand_mask [4];
  nn_iovec iov;
  uint16_t local_50;
  undefined4 local_4c;
  char *local_48;
  nn_iovec local_40;
  
  if (self->state == 4) {
    self->instate = 7;
    nn_pipebase_stop(&self->pipebase);
    nn_msg_array_term(&self->inmsg_array);
    __n = strlen(reason);
    uVar1 = __n + 2;
    if (uVar1 < 0x7e) {
      self->fail_msg[0] = -0x78;
      self->fail_msg[1] = (byte)uVar1;
      self->fail_msg_len = 2;
      local_48 = reason;
      if (self->mode == 2) {
LAB_00139a97:
        pcVar2 = self->fail_msg;
        sVar3 = self->fail_msg_len;
        buf = pcVar2 + sVar3;
        local_50 = (uint16_t)code;
        nn_puts((uint8_t *)buf,local_50);
        self->fail_msg_len = self->fail_msg_len + 2;
        memcpy(pcVar2 + sVar3 + 2,local_48,__n);
        self->fail_msg_len = self->fail_msg_len + __n;
        if ((uVar1 != 0) && (self->mode == 1)) {
          uVar4 = 0;
          do {
            buf[uVar4] = buf[uVar4] ^ *(byte *)((long)&local_4c + (ulong)((uint)uVar4 & 3));
            uVar4 = uVar4 + 1;
          } while ((uVar4 & 0xffffffff) < uVar1);
        }
        if (self->outstate == 1) {
          local_40.iov_len = self->fail_msg_len;
          local_40.iov_base = pcVar2;
          nn_usock_send(self->usock,&local_40,1);
          self->outstate = 2;
          self->state = 5;
        }
        else {
          self->state = 7;
          nn_fsm_raise(&self->fsm,&self->done,2);
        }
        return;
      }
      if (self->mode == 1) {
        self->fail_msg[1] = (byte)uVar1 | 0x80;
        nn_random_generate(&local_4c,4);
        *(undefined4 *)(self->fail_msg + 2) = local_4c;
        self->fail_msg_len = self->fail_msg_len + 4;
        goto LAB_00139a97;
      }
      goto LAB_00139b76;
    }
  }
  else {
    nn_sws_fail_conn_cold_1();
  }
  nn_sws_fail_conn_cold_3();
LAB_00139b76:
  nn_sws_fail_conn_cold_2();
}

Assistant:

static void nn_sws_fail_conn (struct nn_sws *self, int code, char *reason)
{
    size_t reason_len;
    size_t payload_len;
    uint8_t rand_mask [NN_SWS_FRAME_SIZE_MASK];
    uint8_t *payload_pos;
    struct nn_iovec iov;

    nn_assert_state (self, NN_SWS_STATE_ACTIVE);

    /*  Stop user send/recv actions. */
    self->instate = NN_SWS_INSTATE_CLOSED;
    nn_pipebase_stop (&self->pipebase);

    /*  Destroy any remnant incoming message fragments. */
    nn_msg_array_term (&self->inmsg_array);

    reason_len = strlen (reason);

    payload_len = reason_len + NN_SWS_CLOSE_CODE_LEN;

    /*  Ensure text is short enough to also include code and framing. */
    nn_assert (payload_len <= NN_SWS_PAYLOAD_MAX_LENGTH);

    /*  RFC 6455 section 5.5.1. */
    self->fail_msg [0] = (char)(NN_SWS_FRAME_BITMASK_FIN | NN_WS_OPCODE_CLOSE);

    /*  Size of the payload, which is the status code plus the reason. */
    self->fail_msg [1] = (char)payload_len;

    self->fail_msg_len = NN_SWS_FRAME_SIZE_INITIAL;

    switch (self->mode) {
    case NN_WS_SERVER:
        self->fail_msg [1] |= NN_SWS_FRAME_BITMASK_NOT_MASKED;
        break;
    case NN_WS_CLIENT:
        self->fail_msg [1] |= NN_SWS_FRAME_BITMASK_MASKED;

        /*  Generate 32-bit mask as per RFC 6455 5.3. */
        nn_random_generate (rand_mask, NN_SWS_FRAME_SIZE_MASK);

        memcpy (&self->fail_msg [NN_SWS_FRAME_SIZE_INITIAL],
            rand_mask, NN_SWS_FRAME_SIZE_MASK);

        self->fail_msg_len += NN_SWS_FRAME_SIZE_MASK;
        break;
    default:
        /*  Developer error. */
        nn_assert (0);
    }

    payload_pos = (uint8_t*) (&self->fail_msg [self->fail_msg_len]);

    /*  Copy Status Code in network order (big-endian). */
    nn_puts (payload_pos, (uint16_t) code);
    self->fail_msg_len += NN_SWS_CLOSE_CODE_LEN;

    /*  Copy Close Reason immediately following the code. */
    memcpy (payload_pos + NN_SWS_CLOSE_CODE_LEN, reason, reason_len);
    self->fail_msg_len += reason_len;

    /*  If this is a client, apply mask. */
    if (self->mode == NN_WS_CLIENT) {
        nn_sws_mask_payload (payload_pos, payload_len,
            rand_mask, NN_SWS_FRAME_SIZE_MASK, NULL);
    }


    if (self->outstate == NN_SWS_OUTSTATE_IDLE) {
        iov.iov_base = self->fail_msg;
        iov.iov_len = self->fail_msg_len;
        nn_usock_send (self->usock, &iov, 1);
        self->outstate = NN_SWS_OUTSTATE_SENDING;
        self->state = NN_SWS_STATE_CLOSING_CONNECTION;
    } else {
        self->state = NN_SWS_STATE_DONE;
        nn_fsm_raise (&self->fsm, &self->done, NN_SWS_RETURN_CLOSE_HANDSHAKE);
    }

    return;
}